

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  DataKey *pDVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  pointer pnVar6;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  SPxId *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  DataKey DVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  double *pdVar16;
  long lVar17;
  pointer pnVar18;
  fpclass_type fVar19;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar20;
  int32_t *piVar21;
  DataKey *pDVar22;
  int32_t iVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  fpclass_type fVar25;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar26;
  long lVar27;
  int *piVar28;
  long lVar29;
  int *piVar30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  undefined1 local_2b8 [16];
  DataKey local_2a8;
  uint uStack_2a0;
  undefined3 uStack_29b;
  uint local_298;
  undefined3 uStack_293;
  int local_290;
  bool local_28c;
  undefined8 local_288;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_280;
  cpp_dec_float<50U,_int,_void> local_278;
  int local_234;
  int *local_230;
  DataKey local_228;
  DataKey DStack_220;
  DataKey local_218;
  uint uStack_210;
  undefined3 uStack_20b;
  uint local_208;
  uint uStack_204;
  int local_200;
  bool local_1fc;
  undefined8 local_1f8;
  DataKey local_1e8;
  DataKey DStack_1e0;
  DataKey local_1d8;
  uint uStack_1d0;
  undefined3 uStack_1cb;
  uint local_1c8;
  undefined3 uStack_1c3;
  int local_1c0;
  bool local_1bc;
  undefined8 local_1b8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  undefined4 local_16c;
  cpp_dec_float<50U,_int,_void> local_168;
  pointer local_130;
  DataKey *local_128;
  Type local_11c;
  cpp_dec_float<50U,_int,_void> *local_118;
  undefined8 uStack_110;
  cpp_dec_float<50U,_int,_void> *local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  DataKey local_e8;
  uint uStack_e0;
  undefined3 uStack_db;
  uint local_d8;
  undefined3 uStack_d3;
  int local_d0;
  bool local_cc;
  undefined8 local_c8;
  undefined1 local_b8 [16];
  DataKey local_a8;
  uint uStack_a0;
  undefined3 uStack_9b;
  uint local_98;
  undefined3 uStack_93;
  int local_90;
  bool local_8c;
  undefined8 local_88;
  fpclass_type *local_80;
  fpclass_type *local_78;
  pointer local_70;
  int *local_68;
  undefined8 uStack_60;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  undefined8 uStack_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_278.fpclass = cpp_dec_float_finite;
  local_278.prec_elem = 10;
  local_278.data._M_elems[0] = 0;
  local_278.data._M_elems[1] = 0;
  local_278.data._M_elems[2] = 0;
  local_278.data._M_elems[3] = 0;
  local_278.data._M_elems[4] = 0;
  local_278.data._M_elems[5] = 0;
  local_278.data._M_elems[6] = 0;
  local_278.data._M_elems[7] = 0;
  local_278.data._M_elems[8] = 0;
  local_278.data._M_elems[9] = 0;
  local_278.exp = 0;
  local_278.neg = false;
  local_1b8._0_4_ = cpp_dec_float_finite;
  local_1b8._4_4_ = 10;
  local_1e8.info = 0;
  local_1e8.idx = 0;
  DStack_1e0.info = 0;
  DStack_1e0.idx = 0;
  local_1d8.info = 0;
  local_1d8.idx = 0;
  _uStack_1d0 = 0;
  uStack_1cb = 0;
  _local_1c8 = 0;
  uStack_1c3 = 0;
  local_1c0 = 0;
  local_1bc = false;
  local_88._0_4_ = cpp_dec_float_finite;
  local_88._4_4_ = 10;
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_a8.info = 0;
  local_a8.idx = 0;
  _uStack_a0 = 0;
  uStack_9b = 0;
  _local_98 = 0;
  uStack_93 = 0;
  local_90 = 0;
  local_8c = false;
  local_c8._0_4_ = cpp_dec_float_finite;
  local_c8._4_4_ = 10;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_e8.info = 0;
  local_e8.idx = 0;
  _uStack_e0 = 0;
  uStack_db = 0;
  _local_d8 = 0;
  uStack_d3 = 0;
  local_d0 = 0;
  local_cc = false;
  local_11c = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_11c == LEAVE) {
    local_16c = 0;
  }
  else {
    pSVar7 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_16c = (undefined4)CONCAT71((int7)((ulong)pSVar7 >> 8),pSVar7->theRep == ROW);
  }
  uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_1a8.data._M_elems[8] = (uint)uVar5;
  local_1a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar9 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar10 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar11 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_1a8.data._M_elems[4] = (uint)uVar10;
  local_1a8.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
  local_1a8.data._M_elems[6] = (uint)uVar11;
  local_1a8.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
  local_1a8.data._M_elems[0] = (uint)uVar5;
  local_1a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
  local_1a8.data._M_elems[2] = (uint)uVar9;
  local_1a8.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
  local_1a8.exp = (maxabs->m_backend).exp;
  local_1a8.neg = (maxabs->m_backend).neg;
  local_1a8.fpclass = (maxabs->m_backend).fpclass;
  local_1a8.prec_elem = (maxabs->m_backend).prec_elem;
  local_80 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar28 = (update->thedelta).super_IdxSet.idx;
  pnVar6 = (update->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_168.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_168.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_168.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_168.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_168.exp = (val->m_backend).exp;
  local_168.neg = (val->m_backend).neg;
  local_168.fpclass = (val->m_backend).fpclass;
  local_168.prec_elem = (val->m_backend).prec_elem;
  local_280 = this;
  local_40 = val;
  local_38 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    iVar15 = (update->thedelta).super_IdxSet.num;
    local_234 = -1;
    if (start < iVar15) {
      local_230 = piVar28 + iVar15;
      piVar28 = piVar28 + start;
      pnVar1 = &this->epsilon;
      pdVar16 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_58 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)*pdVar16;
      uStack_50 = 0;
      local_108 = (cpp_dec_float<50U,_int,_void> *)-(double)local_58;
      uStack_100 = 0x8000000000000000;
      local_118 = &(local_280->fastDelta).m_backend;
      local_70 = (pointer)((long)incr << 2);
      local_234 = -1;
      pSVar26 = local_280;
      do {
        iVar15 = *piVar28;
        uVar5 = *(undefined8 *)((long)&pnVar6[iVar15].m_backend.data + 0x20);
        local_278.data._M_elems[8] = (uint)uVar5;
        local_278.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)&pnVar6[iVar15].m_backend.data;
        uVar9 = *(undefined8 *)((long)&pnVar6[iVar15].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar6[iVar15].m_backend.data + 0x10);
        uVar10 = *(undefined8 *)puVar2;
        uVar11 = *(undefined8 *)(puVar2 + 2);
        local_278.data._M_elems[4] = (uint)uVar10;
        local_278.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
        local_278.data._M_elems[6] = (uint)uVar11;
        local_278.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
        local_278.data._M_elems[0] = (uint)uVar5;
        local_278.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_278.data._M_elems[2] = (uint)uVar9;
        local_278.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
        local_278.exp = pnVar6[iVar15].m_backend.exp;
        local_278.neg = pnVar6[iVar15].m_backend.neg;
        local_278.fpclass = pnVar6[iVar15].m_backend.fpclass;
        local_278.prec_elem = pnVar6[iVar15].m_backend.prec_elem;
        if (local_11c == LEAVE) {
          pSVar7 = (pSVar26->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          if (pSVar26->iscoid == true) {
            pDVar20 = (pSVar7->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat;
          }
          else {
            pDVar20 = (pSVar7->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat;
          }
          if (pSVar7->theRep * pDVar20->data[iVar15] < 1) goto LAB_002d9c61;
        }
        else {
LAB_002d9c61:
          local_128 = (DataKey *)CONCAT44(local_128._4_4_,iVar15);
          if ((char)local_16c == '\0') {
LAB_002d9cd7:
            fVar25 = local_278.fpclass;
          }
          else {
            pSVar7 = (pSVar26->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar8 = (pSVar7->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (pSVar8[iVar15].super_DataKey.info < 1) goto LAB_002d9cd7;
            local_68 = piVar28;
            SPxColId::SPxColId((SPxColId *)local_2b8,pSVar8 + iVar15);
            iVar14 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar7->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)local_2b8);
            pSVar26 = local_280;
            piVar28 = local_68;
            if ((pSVar7->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar14] == P_FIXED) goto LAB_002da5e4;
            fVar25 = local_278.fpclass;
          }
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          _local_298 = (undefined5)uVar5;
          uStack_293 = (undefined3)((ulong)uVar5 >> 0x28);
          local_2b8 = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
          local_2a8 = *(DataKey *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          _uStack_2a0 = (undefined5)uVar5;
          uStack_29b = (undefined3)((ulong)uVar5 >> 0x28);
          local_290 = (pSVar26->epsilon).m_backend.exp;
          local_28c = (pSVar26->epsilon).m_backend.neg;
          fVar19 = (pSVar26->epsilon).m_backend.fpclass;
          iVar23 = (pSVar26->epsilon).m_backend.prec_elem;
          local_288._0_4_ = (pSVar26->epsilon).m_backend.fpclass;
          local_288._4_4_ = (pSVar26->epsilon).m_backend.prec_elem;
          if (fVar19 == cpp_dec_float_NaN || fVar25 == cpp_dec_float_NaN) {
LAB_002d9e00:
            auVar13 = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
            local_2a8 = *(DataKey *)((this->epsilon).m_backend.data._M_elems + 4);
            uVar9 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
            _local_298 = (undefined5)uVar5;
            uStack_293 = (undefined3)((ulong)uVar5 >> 0x28);
            _uStack_2a0 = (undefined5)uVar9;
            uStack_29b = (undefined3)((ulong)uVar9 >> 0x28);
            local_288._4_4_ = iVar23;
            local_288._0_4_ = fVar19;
            local_2b8._0_4_ = (undefined4)*(undefined8 *)(pnVar1->m_backend).data._M_elems;
            if (local_2b8._0_4_ != 0 || fVar19 != cpp_dec_float_finite) {
              local_28c = (bool)(local_28c ^ 1);
            }
            local_2b8 = auVar13;
            if (((fVar19 == cpp_dec_float_NaN) || (local_278.fpclass == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
               pSVar26 = local_280, -1 < iVar14)) goto LAB_002da5e4;
            local_2b8._4_4_ = local_278.data._M_elems[1];
            local_2b8._0_4_ = local_278.data._M_elems[0];
            local_2b8._12_4_ = local_278.data._M_elems[3];
            local_2b8._8_4_ = local_278.data._M_elems[2];
            local_2a8.idx = local_278.data._M_elems[5];
            local_2a8.info = local_278.data._M_elems[4];
            _local_298 = (undefined5)CONCAT44(local_278.data._M_elems[9],local_278.data._M_elems[8])
            ;
            uStack_293 = (undefined3)(local_278.data._M_elems[9] >> 8);
            _uStack_2a0 = (undefined5)
                          CONCAT44(local_278.data._M_elems[7],local_278.data._M_elems[6]);
            uStack_29b = (undefined3)(local_278.data._M_elems[7] >> 8);
            local_290 = local_278.exp;
            local_28c = local_278.neg;
            local_288._0_4_ = local_278.fpclass;
            local_288._4_4_ = local_278.prec_elem;
            if (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) {
              local_28c = (bool)(local_278.neg ^ 1);
            }
            if (local_1a8.fpclass == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002da0f5:
              local_228.idx = local_1a8.data._M_elems[2];
              local_228.info = local_1a8.data._M_elems[1];
              DStack_220.idx = local_1a8.data._M_elems[4];
              DStack_220.info = local_1a8.data._M_elems[3];
              local_218.idx = local_1a8.data._M_elems[6];
              local_218.info = local_1a8.data._M_elems[5];
              _uStack_210 = (undefined5)
                            CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]);
              uStack_20b = (undefined3)(local_1a8.data._M_elems[8] >> 8);
              local_208 = local_1a8.data._M_elems[9];
            }
            else {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_1a8);
              if (iVar14 < 1) {
                goto LAB_002da0f5;
              }
              local_228.idx = local_278.data._M_elems[2];
              local_228.info = local_278.data._M_elems[1];
              DStack_220.idx = local_278.data._M_elems[4];
              DStack_220.info = local_278.data._M_elems[3];
              local_218.idx = local_278.data._M_elems[6];
              local_218.info = local_278.data._M_elems[5];
              _uStack_210 = (undefined5)
                            CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
              uStack_20b = (undefined3)(local_278.data._M_elems[8] >> 8);
              local_208 = local_278.data._M_elems[9];
              local_1a8.data._M_elems[0] = 0;
              local_1a8.exp = local_278.exp;
              local_1a8.prec_elem = local_278.prec_elem;
              if (local_278.fpclass == cpp_dec_float_finite && local_278.data._M_elems[0] == 0) {
                local_1a8.fpclass = cpp_dec_float_finite;
                local_1a8.neg = local_278.neg;
              }
              else {
                local_1a8.neg = (bool)(local_278.neg ^ 1);
                local_1a8.fpclass = local_278.fpclass;
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
              }
            }
            local_1a8.data._M_elems[9] = local_208;
            local_1a8.data._M_elems[5] = local_218.info;
            local_1a8.data._M_elems[6] = local_218.idx;
            local_1a8.data._M_elems[7] = (uint)_uStack_210;
            local_1a8.data._M_elems[8] = (uint)(CONCAT35(uStack_20b,_uStack_210) >> 0x20);
            local_1a8.data._M_elems[1] = local_228.info;
            local_1a8.data._M_elems[2] = local_228.idx;
            local_1a8.data._M_elems[3] = DStack_220.info;
            local_1a8.data._M_elems[4] = DStack_220.idx;
            local_b8._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).data
            ;
            local_b8._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).data + 8);
            pDVar22 = (DataKey *)
                      ((long)&(((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).data +
                      0x10);
            local_a8 = *pDVar22;
            DVar12 = pDVar22[1];
            _uStack_a0 = DVar12._0_5_;
            uStack_9b = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).data +
                     0x20);
            _local_98 = (undefined5)uVar5;
            uStack_93 = (undefined3)((ulong)uVar5 >> 0x28);
            local_90 = (((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).exp;
            local_8c = (((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).neg;
            local_88._0_4_ = (((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).fpclass;
            local_88._4_4_ =
                 (((pointer)((long)local_80 + (long)iVar15 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,(double)local_58);
            pSVar26 = local_280;
            if ((((fpclass_type)local_88 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_b8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar26 = local_280
               , -1 < iVar14)) goto LAB_002da5e4;
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_2b8 == &local_130[iVar15].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_b8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_98;
              uStack_293 = uStack_93;
              local_2a8 = local_a8;
              _uStack_2a0 = _uStack_a0;
              uStack_29b = uStack_9b;
              local_2b8._8_8_ = local_b8._8_8_;
              local_2b8._0_8_ = local_b8._0_8_;
              local_290 = local_90;
              local_28c = local_8c;
              local_288._0_4_ = (fpclass_type)local_88;
              local_288._4_4_ = local_88._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_130[iVar15].m_backend);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar13 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar13;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002da6bc:
              local_1f8._0_4_ = cpp_dec_float_finite;
              local_1f8._4_4_ = 10;
              local_228.info = 0;
              local_228.idx = 0;
              DStack_220.info = 0;
              DStack_220.idx = 0;
              local_218.info = 0;
              local_218.idx = 0;
              _uStack_210 = 0;
              uStack_20b = 0;
              local_208 = 0;
              uStack_204 = 0;
              local_200 = 0;
              local_1fc = false;
              pcVar24 = (cpp_dec_float<50U,_int,_void> *)&local_1e8;
              if ((cpp_dec_float<50U,_int,_void> *)&local_228 != local_118) {
                local_208 = (uint)_local_1c8;
                uStack_204 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_218 = local_1d8;
                _uStack_210 = _uStack_1d0;
                uStack_20b = uStack_1cb;
                local_228 = local_1e8;
                DStack_220 = DStack_1e0;
                local_200 = local_1c0;
                local_1fc = local_1bc;
                local_1f8._0_4_ = (fpclass_type)local_1b8;
                local_1f8._4_4_ = local_1b8._4_4_;
                pcVar24 = local_118;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)&local_228,pcVar24);
              pcVar24 = (cpp_dec_float<50U,_int,_void> *)&local_228;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              pcVar24 = local_118;
              if (0 < iVar15) goto LAB_002da6bc;
            }
            local_28c = false;
            local_290 = 0;
            uStack_293 = 0;
            _local_298 = 0;
            uStack_29b = 0;
            _uStack_2a0 = 0;
            local_2b8 = ZEXT816(0);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar24,&local_278);
            local_278.data._M_elems[8] = (uint)_local_298;
            local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
            local_278.data._M_elems[4] = local_2a8.info;
            local_278.data._M_elems[5] = local_2a8.idx;
            local_278.data._M_elems[6] = (uint)_uStack_2a0;
            local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
            local_278.data._M_elems[0] = local_2b8._0_4_;
            local_278.data._M_elems[1] = local_2b8._4_4_;
            local_278.data._M_elems[2] = local_2b8._8_4_;
            local_278.data._M_elems[3] = local_2b8._12_4_;
            local_278.exp = local_290;
            local_278.neg = local_28c;
            local_278.fpclass = (fpclass_type)local_288;
            local_278.prec_elem = local_288._4_4_;
            pSVar26 = local_280;
            if (((fpclass_type)local_288 == cpp_dec_float_NaN) ||
               (local_168.fpclass == cpp_dec_float_NaN)) goto LAB_002da5e4;
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_168);
          }
          else {
            iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
            if (iVar14 < 1) {
              local_290 = (local_280->epsilon).m_backend.exp;
              local_28c = (local_280->epsilon).m_backend.neg;
              fVar19 = (local_280->epsilon).m_backend.fpclass;
              iVar23 = (local_280->epsilon).m_backend.prec_elem;
              pSVar26 = local_280;
              goto LAB_002d9e00;
            }
            piVar21 = &local_1a8.prec_elem;
            fVar25 = local_1a8.fpclass;
            if (local_1a8.fpclass != cpp_dec_float_NaN && local_278.fpclass != cpp_dec_float_NaN) {
              iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_1a8);
              if (iVar14 < 1) {
                piVar21 = &local_1a8.prec_elem;
                fVar25 = local_1a8.fpclass;
              }
              else {
                local_1a8.data._M_elems[8] = local_278.data._M_elems[8];
                local_1a8.data._M_elems[9] = local_278.data._M_elems[9];
                local_1a8.data._M_elems[4] = local_278.data._M_elems[4];
                local_1a8.data._M_elems[5] = local_278.data._M_elems[5];
                local_1a8.data._M_elems[6] = local_278.data._M_elems[6];
                local_1a8.data._M_elems[7] = local_278.data._M_elems[7];
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
                local_1a8.data._M_elems[1] = local_278.data._M_elems[1];
                local_1a8.data._M_elems[2] = local_278.data._M_elems[2];
                local_1a8.data._M_elems[3] = local_278.data._M_elems[3];
                local_1a8.exp = local_278.exp;
                local_1a8.neg = local_278.neg;
                piVar21 = &local_278.prec_elem;
                fVar25 = local_278.fpclass;
              }
            }
            local_1a8.fpclass = fVar25;
            local_1a8.prec_elem = *piVar21;
            local_f8._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).data
            ;
            local_f8._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).data + 8);
            pDVar22 = (DataKey *)
                      ((long)&(((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).data +
                      0x10);
            local_e8 = *pDVar22;
            DVar12 = pDVar22[1];
            _uStack_e0 = DVar12._0_5_;
            uStack_db = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).data +
                     0x20);
            _local_d8 = (undefined5)uVar5;
            uStack_d3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_d0 = (((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).exp;
            local_cc = (((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).neg;
            local_c8._0_4_ = (((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).fpclass;
            local_c8._4_4_ =
                 (((pointer)((long)local_78 + (long)iVar15 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,(double)local_108);
            pSVar26 = local_280;
            if ((((fpclass_type)local_c8 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar14 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_f8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar26 = local_280
               , iVar14 < 1)) goto LAB_002da5e4;
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_2b8 == &local_130[iVar15].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_f8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_d8;
              uStack_293 = uStack_d3;
              local_2a8 = local_e8;
              _uStack_2a0 = _uStack_e0;
              uStack_29b = uStack_db;
              local_2b8._8_8_ = local_f8._8_8_;
              local_2b8._0_8_ = local_f8._0_8_;
              local_290 = local_d0;
              local_28c = local_cc;
              local_288._0_4_ = (fpclass_type)local_c8;
              local_288._4_4_ = local_c8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_130[iVar15].m_backend);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar13 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar13;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002da422:
              local_1f8._0_4_ = cpp_dec_float_finite;
              local_1f8._4_4_ = 10;
              local_228.info = 0;
              local_228.idx = 0;
              DStack_220.info = 0;
              DStack_220.idx = 0;
              local_218.info = 0;
              local_218.idx = 0;
              _uStack_210 = 0;
              uStack_20b = 0;
              local_208 = 0;
              uStack_204 = 0;
              local_200 = 0;
              local_1fc = false;
              if ((cpp_dec_float<50U,_int,_void> *)&local_228 == local_118) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_228,
                           (cpp_dec_float<50U,_int,_void> *)&local_1e8);
                if (local_228.info != 0 || (fpclass_type)local_1f8 != cpp_dec_float_finite) {
                  local_1fc = (bool)(local_1fc ^ 1);
                }
              }
              else {
                local_208 = (uint)_local_1c8;
                uStack_204 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_218 = local_1d8;
                _uStack_210 = _uStack_1d0;
                uStack_20b = uStack_1cb;
                local_228 = local_1e8;
                DStack_220 = DStack_1e0;
                local_200 = local_1c0;
                local_1fc = local_1bc;
                local_1f8._0_4_ = (fpclass_type)local_1b8;
                local_1f8._4_4_ = local_1b8._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_228,local_118);
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              if (iVar15 < 0) goto LAB_002da422;
              uVar5 = *(undefined8 *)((local_118->data)._M_elems + 8);
              local_208 = (uint)uVar5;
              uStack_204 = (uint)((ulong)uVar5 >> 0x20);
              local_228.info = (local_118->data)._M_elems[0];
              local_228.idx = (local_118->data)._M_elems[1];
              DStack_220 = *(DataKey *)((local_118->data)._M_elems + 2);
              local_218 = *(DataKey *)((local_118->data)._M_elems + 4);
              uVar5 = *(undefined8 *)((local_118->data)._M_elems + 6);
              _uStack_210 = (undefined5)uVar5;
              uStack_20b = (undefined3)((ulong)uVar5 >> 0x28);
              local_200 = (local_280->fastDelta).m_backend.exp;
              local_1fc = (local_280->fastDelta).m_backend.neg;
              local_1f8._0_4_ = (local_280->fastDelta).m_backend.fpclass;
              local_1f8._4_4_ = (local_280->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_1f8 != cpp_dec_float_finite || local_228.info != 0) {
                local_1fc = (bool)(local_1fc ^ 1);
              }
            }
            local_2b8 = ZEXT816(0);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_28c = false;
            local_290 = 0;
            uStack_293 = 0;
            _local_298 = 0;
            uStack_29b = 0;
            _uStack_2a0 = 0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                       (cpp_dec_float<50U,_int,_void> *)&local_228,&local_278);
            local_278.data._M_elems[8] = (uint)_local_298;
            local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
            local_278.data._M_elems[4] = local_2a8.info;
            local_278.data._M_elems[5] = local_2a8.idx;
            local_278.data._M_elems[6] = (uint)_uStack_2a0;
            local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
            local_278.data._M_elems[0] = local_2b8._0_4_;
            local_278.data._M_elems[1] = local_2b8._4_4_;
            local_278.data._M_elems[2] = local_2b8._8_4_;
            local_278.data._M_elems[3] = local_2b8._12_4_;
            local_278.exp = local_290;
            local_278.neg = local_28c;
            local_278.fpclass = (fpclass_type)local_288;
            local_278.prec_elem = local_288._4_4_;
            pSVar26 = local_280;
            if (((fpclass_type)local_288 == cpp_dec_float_NaN) ||
               (local_168.fpclass == cpp_dec_float_NaN)) goto LAB_002da5e4;
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_168);
          }
          pSVar26 = local_280;
          if (0 < iVar15) {
            local_168.data._M_elems[9] = local_278.data._M_elems[9];
            local_168.data._M_elems[8] = local_278.data._M_elems[8];
            local_168.data._M_elems[1] = local_278.data._M_elems[1];
            local_168.data._M_elems[0] = local_278.data._M_elems[0];
            local_168.data._M_elems[3] = local_278.data._M_elems[3];
            local_168.data._M_elems[2] = local_278.data._M_elems[2];
            local_168.data._M_elems[5] = local_278.data._M_elems[5];
            local_168.data._M_elems[4] = local_278.data._M_elems[4];
            local_168.data._M_elems[7] = local_278.data._M_elems[7];
            local_168.data._M_elems[6] = local_278.data._M_elems[6];
            local_234 = (int)local_128;
            local_168.exp = local_278.exp;
            local_168.neg = local_278.neg;
            local_168._48_8_ = local_278._48_8_;
          }
        }
LAB_002da5e4:
        piVar28 = (int *)((long)piVar28 + (long)local_70);
      } while (piVar28 < local_230);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar17 = (long)((int)((ulong)((long)(update->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_130
                                 ) >> 3) * -0x49249249);
    local_58 = update;
    piVar30 = piVar28;
    if (lVar17 < 1) {
      local_234 = -1;
    }
    else {
      local_70 = pnVar6 + lVar17;
      pDVar22 = (DataKey *)&this->epsilon;
      pdVar16 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_118 = (cpp_dec_float<50U,_int,_void> *)*pdVar16;
      uStack_110 = 0;
      local_68 = (int *)-(double)local_118;
      uStack_60 = 0x8000000000000000;
      local_108 = &(local_280->fastDelta).m_backend;
      local_78 = &((cpp_dec_float<50U,_int,_void> *)local_78)->fpclass;
      local_80 = &((cpp_dec_float<50U,_int,_void> *)local_80)->fpclass;
      local_234 = -1;
      lVar29 = 0;
      lVar17 = 0;
      lVar27 = 0;
      pSVar26 = local_280;
      local_128 = pDVar22;
      do {
        uVar5 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x20);
        local_278.data._M_elems[8] = (uint)uVar5;
        local_278.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        puVar4 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar17);
        uVar5 = *puVar4;
        uVar9 = puVar4[1];
        puVar4 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x10);
        uVar10 = *puVar4;
        uVar11 = puVar4[1];
        local_278.data._M_elems[4] = (uint)uVar10;
        local_278.data._M_elems[5] = (uint)((ulong)uVar10 >> 0x20);
        local_278.data._M_elems[6] = (uint)uVar11;
        local_278.data._M_elems[7] = (uint)((ulong)uVar11 >> 0x20);
        local_278.data._M_elems[0] = (uint)uVar5;
        local_278.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_278.data._M_elems[2] = (uint)uVar9;
        local_278.data._M_elems[3] = (uint)((ulong)uVar9 >> 0x20);
        local_278.exp = *(int *)((long)&(pnVar6->m_backend).data + lVar17 + 0x28);
        local_278.neg = *(bool *)((long)&(pnVar6->m_backend).data + lVar17 + 0x2c);
        local_278._48_8_ = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar17 + 0x30);
        if (local_278.fpclass == cpp_dec_float_NaN) {
LAB_002da98d:
          _local_298 = SUB85(pDVar22[4],0);
          uStack_293 = SUB83(pDVar22[4],5);
          auVar13 = *(undefined1 (*) [16])pDVar22;
          local_2a8 = pDVar22[2];
          _uStack_2a0 = SUB85(pDVar22[3],0);
          uStack_29b = SUB83(pDVar22[3],5);
          local_290 = (pSVar26->epsilon).m_backend.exp;
          local_28c = (pSVar26->epsilon).m_backend.neg;
          local_288._0_4_ = (pSVar26->epsilon).m_backend.fpclass;
          local_288._4_4_ = (pSVar26->epsilon).m_backend.prec_elem;
          local_2b8._0_4_ = (*pDVar22).info;
          if (local_2b8._0_4_ != 0 || (fpclass_type)local_288 != cpp_dec_float_finite) {
            local_28c = (bool)(local_28c ^ 1);
          }
          local_2b8 = auVar13;
          if ((((fpclass_type)local_288 != cpp_dec_float_NaN) &&
              (local_278.fpclass != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
             pSVar26 = local_280, -1 < iVar15)) {
            local_208 = pDVar22[4].info;
            uStack_204 = pDVar22[4].idx;
            local_228 = *pDVar22;
            DStack_220 = pDVar22[1];
            local_218 = pDVar22[2];
            _uStack_210 = SUB85(pDVar22[3],0);
            uStack_20b = SUB83(pDVar22[3],5);
            local_200 = (local_280->epsilon).m_backend.exp;
            local_1fc = (local_280->epsilon).m_backend.neg;
            local_1f8._0_4_ = (local_280->epsilon).m_backend.fpclass;
            local_1f8._4_4_ = (local_280->epsilon).m_backend.prec_elem;
            if (((fpclass_type)local_1f8 != cpp_dec_float_NaN &&
                 local_278.fpclass != cpp_dec_float_NaN) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_278,(cpp_dec_float<50U,_int,_void> *)&local_228),
               pSVar26 = local_280, iVar15 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)((long)&(pnVar6->m_backend).data + lVar17),
                         0.0);
              pSVar26 = local_280;
              goto LAB_002db581;
            }
          }
          piVar28 = piVar30 + 1;
          *piVar30 = (int)lVar27;
          if (local_11c == LEAVE) {
            pSVar7 = (pSVar26->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            if (pSVar26->iscoid == true) {
              pDVar20 = (pSVar7->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.costat;
            }
            else {
              pDVar20 = (pSVar7->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat;
            }
            piVar30 = piVar28;
            if (0 < pSVar7->theRep * pDVar20->data[lVar27]) goto LAB_002db581;
          }
          local_230 = piVar28;
          if ((char)local_16c != '\0') {
            pSVar7 = (pSVar26->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar8 = (pSVar7->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < *(int *)((long)&(pSVar8->super_DataKey).info + lVar29)) {
              SPxColId::SPxColId((SPxColId *)local_2b8,
                                 (SPxId *)((long)&(pSVar8->super_DataKey).info + lVar29));
              pDVar22 = local_128;
              iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar7->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)local_2b8);
              pSVar26 = local_280;
              piVar30 = local_230;
              if ((pSVar7->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar15] == P_FIXED) goto LAB_002db581;
            }
          }
          _local_298 = SUB85(pDVar22[4],0);
          uStack_293 = SUB83(pDVar22[4],5);
          local_2b8 = *(undefined1 (*) [16])pDVar22;
          local_2a8 = pDVar22[2];
          _uStack_2a0 = SUB85(pDVar22[3],0);
          uStack_29b = SUB83(pDVar22[3],5);
          local_290 = (pSVar26->epsilon).m_backend.exp;
          local_28c = (pSVar26->epsilon).m_backend.neg;
          fVar25 = (pSVar26->epsilon).m_backend.fpclass;
          iVar23 = (pSVar26->epsilon).m_backend.prec_elem;
          local_288._0_4_ = (pSVar26->epsilon).m_backend.fpclass;
          local_288._4_4_ = (pSVar26->epsilon).m_backend.prec_elem;
          if (fVar25 == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002dac66:
            local_2a8 = pDVar22[2];
            _local_298 = SUB85(pDVar22[4],0);
            uStack_293 = SUB83(pDVar22[4],5);
            _uStack_2a0 = SUB85(pDVar22[3],0);
            uStack_29b = SUB83(pDVar22[3],5);
            local_288._4_4_ = iVar23;
            local_288._0_4_ = fVar25;
            local_2b8._0_4_ = (*pDVar22).info;
            if (local_2b8._0_4_ != 0 || fVar25 != cpp_dec_float_finite) {
              local_28c = (bool)(local_28c ^ 1);
            }
            piVar30 = local_230;
            if (((fVar25 == cpp_dec_float_NaN) || (local_278.fpclass == cpp_dec_float_NaN)) ||
               (local_2b8 = *(undefined1 (*) [16])pDVar22,
               iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8),
               pSVar26 = local_280, piVar30 = local_230, -1 < iVar15)) goto LAB_002db581;
            local_2b8._4_4_ = local_278.data._M_elems[1];
            local_2b8._0_4_ = local_278.data._M_elems[0];
            local_2b8._12_4_ = local_278.data._M_elems[3];
            local_2b8._8_4_ = local_278.data._M_elems[2];
            local_2a8.idx = local_278.data._M_elems[5];
            local_2a8.info = local_278.data._M_elems[4];
            _local_298 = (undefined5)CONCAT44(local_278.data._M_elems[9],local_278.data._M_elems[8])
            ;
            uStack_293 = (undefined3)(local_278.data._M_elems[9] >> 8);
            _uStack_2a0 = (undefined5)
                          CONCAT44(local_278.data._M_elems[7],local_278.data._M_elems[6]);
            uStack_29b = (undefined3)(local_278.data._M_elems[7] >> 8);
            local_290 = local_278.exp;
            local_28c = local_278.neg;
            local_288._0_4_ = local_278.fpclass;
            local_288._4_4_ = local_278.prec_elem;
            if (local_278.data._M_elems[0] != 0 || local_278.fpclass != cpp_dec_float_finite) {
              local_28c = (bool)(local_278.neg ^ 1);
            }
            if (local_1a8.fpclass == cpp_dec_float_NaN || local_278.fpclass == cpp_dec_float_NaN) {
LAB_002daf5f:
              local_228.idx = local_1a8.data._M_elems[2];
              local_228.info = local_1a8.data._M_elems[1];
              DStack_220.idx = local_1a8.data._M_elems[4];
              DStack_220.info = local_1a8.data._M_elems[3];
              local_218.idx = local_1a8.data._M_elems[6];
              local_218.info = local_1a8.data._M_elems[5];
              _uStack_210 = (undefined5)
                            CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]);
              uStack_20b = (undefined3)(local_1a8.data._M_elems[8] >> 8);
              local_208 = local_1a8.data._M_elems[9];
            }
            else {
              iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2b8,&local_1a8);
              if (iVar15 < 1) {
                goto LAB_002daf5f;
              }
              local_228.idx = local_278.data._M_elems[2];
              local_228.info = local_278.data._M_elems[1];
              DStack_220.idx = local_278.data._M_elems[4];
              DStack_220.info = local_278.data._M_elems[3];
              local_218.idx = local_278.data._M_elems[6];
              local_218.info = local_278.data._M_elems[5];
              _uStack_210 = (undefined5)
                            CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
              uStack_20b = (undefined3)(local_278.data._M_elems[8] >> 8);
              local_208 = local_278.data._M_elems[9];
              local_1a8.data._M_elems[0] = 0;
              local_1a8.exp = local_278.exp;
              local_1a8.prec_elem = local_278.prec_elem;
              if (local_278.fpclass == cpp_dec_float_finite && local_278.data._M_elems[0] == 0) {
                local_1a8.fpclass = cpp_dec_float_finite;
                local_1a8.neg = local_278.neg;
              }
              else {
                local_1a8.neg = (bool)(local_278.neg ^ 1);
                local_1a8.fpclass = local_278.fpclass;
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
              }
            }
            local_1a8.data._M_elems[9] = local_208;
            local_1a8.data._M_elems[5] = local_218.info;
            local_1a8.data._M_elems[6] = local_218.idx;
            local_1a8.data._M_elems[7] = (uint)_uStack_210;
            local_1a8.data._M_elems[8] = (uint)(CONCAT35(uStack_20b,_uStack_210) >> 0x20);
            local_1a8.data._M_elems[1] = local_228.info;
            local_1a8.data._M_elems[2] = local_228.idx;
            local_1a8.data._M_elems[3] = DStack_220.info;
            local_1a8.data._M_elems[4] = DStack_220.idx;
            puVar2 = (uint *)((long)local_80 + lVar17 + -0x30);
            local_b8._0_8_ = *(undefined8 *)puVar2;
            local_b8._8_8_ = *(undefined8 *)(puVar2 + 2);
            pDVar3 = (DataKey *)((long)local_80 + lVar17 + -0x20);
            local_a8 = *pDVar3;
            DVar12 = pDVar3[1];
            _uStack_a0 = DVar12._0_5_;
            uStack_9b = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)((long)local_80 + lVar17 + -0x10);
            _local_98 = (undefined5)uVar5;
            uStack_93 = (undefined3)((ulong)uVar5 >> 0x28);
            local_90 = *(int *)((long)local_80 + lVar17 + -8);
            local_8c = *(bool *)((long)local_80 + lVar17 + -4);
            local_88 = *(undefined8 *)((long)local_80 + lVar17);
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,(double)local_118);
            pSVar26 = local_280;
            piVar30 = local_230;
            if ((((fpclass_type)local_88 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_b8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar26 = local_280
               , piVar30 = local_230, -1 < iVar15)) goto LAB_002db581;
            pcVar24 = (cpp_dec_float<50U,_int,_void> *)((long)&local_130->m_backend + lVar17);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if (pcVar24 == (cpp_dec_float<50U,_int,_void> *)local_2b8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_b8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_98;
              uStack_293 = uStack_93;
              local_2a8 = local_a8;
              _uStack_2a0 = _uStack_a0;
              uStack_29b = uStack_9b;
              local_2b8._8_8_ = local_b8._8_8_;
              local_2b8._0_8_ = local_b8._0_8_;
              local_290 = local_90;
              local_28c = local_8c;
              local_288._0_4_ = (fpclass_type)local_88;
              local_288._4_4_ = local_88._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar24);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar13 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar13;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002db3d2:
              local_1f8._0_4_ = cpp_dec_float_finite;
              local_1f8._4_4_ = 10;
              local_228.info = 0;
              local_228.idx = 0;
              DStack_220.info = 0;
              DStack_220.idx = 0;
              local_218.info = 0;
              local_218.idx = 0;
              _uStack_210 = 0;
              uStack_20b = 0;
              local_208 = 0;
              uStack_204 = 0;
              local_200 = 0;
              local_1fc = false;
              pcVar24 = (cpp_dec_float<50U,_int,_void> *)&local_1e8;
              if ((cpp_dec_float<50U,_int,_void> *)&local_228 != local_108) {
                local_208 = (uint)_local_1c8;
                uStack_204 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_218 = local_1d8;
                _uStack_210 = _uStack_1d0;
                uStack_20b = uStack_1cb;
                local_228 = local_1e8;
                DStack_220 = DStack_1e0;
                local_200 = local_1c0;
                local_1fc = local_1bc;
                local_1f8._0_4_ = (fpclass_type)local_1b8;
                local_1f8._4_4_ = local_1b8._4_4_;
                pcVar24 = local_108;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)&local_228,pcVar24);
              goto LAB_002db478;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                (cpp_dec_float<50U,_int,_void> *)local_2b8);
            pcVar24 = local_108;
            if (0 < iVar15) goto LAB_002db3d2;
          }
          else {
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
            if (iVar15 < 1) {
              local_290 = (local_280->epsilon).m_backend.exp;
              local_28c = (local_280->epsilon).m_backend.neg;
              fVar25 = (local_280->epsilon).m_backend.fpclass;
              iVar23 = (local_280->epsilon).m_backend.prec_elem;
              pSVar26 = local_280;
              goto LAB_002dac66;
            }
            piVar21 = &local_1a8.prec_elem;
            fVar25 = local_1a8.fpclass;
            if (local_1a8.fpclass != cpp_dec_float_NaN && local_278.fpclass != cpp_dec_float_NaN) {
              iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_1a8);
              if (iVar15 < 1) {
                piVar21 = &local_1a8.prec_elem;
                fVar25 = local_1a8.fpclass;
              }
              else {
                local_1a8.data._M_elems[8] = local_278.data._M_elems[8];
                local_1a8.data._M_elems[9] = local_278.data._M_elems[9];
                local_1a8.data._M_elems[4] = local_278.data._M_elems[4];
                local_1a8.data._M_elems[5] = local_278.data._M_elems[5];
                local_1a8.data._M_elems[6] = local_278.data._M_elems[6];
                local_1a8.data._M_elems[7] = local_278.data._M_elems[7];
                local_1a8.data._M_elems[0] = local_278.data._M_elems[0];
                local_1a8.data._M_elems[1] = local_278.data._M_elems[1];
                local_1a8.data._M_elems[2] = local_278.data._M_elems[2];
                local_1a8.data._M_elems[3] = local_278.data._M_elems[3];
                local_1a8.exp = local_278.exp;
                local_1a8.neg = local_278.neg;
                piVar21 = &local_278.prec_elem;
                fVar25 = local_278.fpclass;
              }
            }
            local_1a8.fpclass = fVar25;
            local_1a8.prec_elem = *piVar21;
            puVar2 = (uint *)((long)local_78 + lVar17 + -0x30);
            local_f8._0_8_ = *(undefined8 *)puVar2;
            local_f8._8_8_ = *(undefined8 *)(puVar2 + 2);
            pDVar3 = (DataKey *)((long)local_78 + lVar17 + -0x20);
            local_e8 = *pDVar3;
            DVar12 = pDVar3[1];
            _uStack_e0 = DVar12._0_5_;
            uStack_db = DVar12.idx._1_3_;
            uVar5 = *(undefined8 *)((long)local_78 + lVar17 + -0x10);
            _local_d8 = (undefined5)uVar5;
            uStack_d3 = (undefined3)((ulong)uVar5 >> 0x28);
            local_d0 = *(int *)((long)local_78 + lVar17 + -8);
            local_cc = *(bool *)((long)local_78 + lVar17 + -4);
            local_c8 = *(undefined8 *)((long)local_78 + lVar17);
            ::soplex::infinity::__tls_init();
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = ZEXT816(0);
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_2b8,(double)local_68);
            pSVar26 = local_280;
            piVar30 = local_230;
            if ((((fpclass_type)local_c8 == cpp_dec_float_NaN) ||
                ((fpclass_type)local_288 == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_f8,
                                    (cpp_dec_float<50U,_int,_void> *)local_2b8), pSVar26 = local_280
               , piVar30 = local_230, iVar15 < 1)) goto LAB_002db581;
            pcVar24 = (cpp_dec_float<50U,_int,_void> *)((long)&local_130->m_backend + lVar17);
            local_288._0_4_ = cpp_dec_float_finite;
            local_288._4_4_ = 10;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8.info = 0;
            local_2a8.idx = 0;
            _uStack_2a0 = 0;
            uStack_29b = 0;
            _local_298 = 0;
            uStack_293 = 0;
            local_290 = 0;
            local_28c = false;
            if (pcVar24 == (cpp_dec_float<50U,_int,_void> *)local_2b8) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                         (cpp_dec_float<50U,_int,_void> *)local_f8);
              if (local_2b8._0_4_ == 0 && (fpclass_type)local_288 == cpp_dec_float_finite) {
                local_1b8._0_4_ = cpp_dec_float_finite;
              }
              else {
                local_28c = (bool)(local_28c ^ 1);
                local_1b8._0_4_ = (fpclass_type)local_288;
              }
            }
            else {
              _local_298 = _local_d8;
              uStack_293 = uStack_d3;
              local_2a8 = local_e8;
              _uStack_2a0 = _uStack_e0;
              uStack_29b = uStack_db;
              local_2b8._8_8_ = local_f8._8_8_;
              local_2b8._0_8_ = local_f8._0_8_;
              local_290 = local_d0;
              local_28c = local_cc;
              local_288._0_4_ = (fpclass_type)local_c8;
              local_288._4_4_ = local_c8._4_4_;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar24);
              local_1b8._0_4_ = (fpclass_type)local_288;
            }
            auVar13 = local_2b8;
            _local_1c8 = _local_298;
            uStack_1c3 = uStack_293;
            local_1d8 = local_2a8;
            _uStack_1d0 = _uStack_2a0;
            uStack_1cb = uStack_29b;
            local_1e8.info = local_2b8._0_4_;
            local_1e8.idx = local_2b8._4_4_;
            DStack_1e0.info = local_2b8._8_4_;
            DStack_1e0.idx = local_2b8._12_4_;
            local_1c0 = local_290;
            local_1b8._4_4_ = local_288._4_4_;
            local_2b8 = auVar13;
            local_1bc = local_28c;
            if ((fpclass_type)local_1b8 == cpp_dec_float_NaN) {
LAB_002db257:
              local_1f8._0_4_ = cpp_dec_float_finite;
              local_1f8._4_4_ = 10;
              local_228.info = 0;
              local_228.idx = 0;
              DStack_220.info = 0;
              DStack_220.idx = 0;
              local_218.info = 0;
              local_218.idx = 0;
              _uStack_210 = 0;
              uStack_20b = 0;
              local_208 = 0;
              uStack_204 = 0;
              local_200 = 0;
              local_1fc = false;
              if ((cpp_dec_float<50U,_int,_void> *)&local_228 == local_108) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_228,
                           (cpp_dec_float<50U,_int,_void> *)&local_1e8);
                if (local_228.info != 0 || (fpclass_type)local_1f8 != cpp_dec_float_finite) {
                  local_1fc = (bool)(local_1fc ^ 1);
                }
              }
              else {
                local_208 = (uint)_local_1c8;
                uStack_204 = (uint)(CONCAT35(uStack_1c3,_local_1c8) >> 0x20);
                local_218 = local_1d8;
                _uStack_210 = _uStack_1d0;
                uStack_20b = uStack_1cb;
                local_228 = local_1e8;
                DStack_220 = DStack_1e0;
                local_200 = local_1c0;
                local_1fc = local_1bc;
                local_1f8._0_4_ = (fpclass_type)local_1b8;
                local_1f8._4_4_ = local_1b8._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)&local_228,local_108);
              }
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_2b8,0,(type *)0x0);
              iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_1e8,
                                  (cpp_dec_float<50U,_int,_void> *)local_2b8);
              if (iVar15 < 0) goto LAB_002db257;
              uVar5 = *(undefined8 *)((local_108->data)._M_elems + 8);
              local_208 = (uint)uVar5;
              uStack_204 = (uint)((ulong)uVar5 >> 0x20);
              local_228.info = (local_108->data)._M_elems[0];
              local_228.idx = (local_108->data)._M_elems[1];
              DStack_220 = *(DataKey *)((local_108->data)._M_elems + 2);
              local_218 = *(DataKey *)((local_108->data)._M_elems + 4);
              uVar5 = *(undefined8 *)((local_108->data)._M_elems + 6);
              _uStack_210 = (undefined5)uVar5;
              uStack_20b = (undefined3)((ulong)uVar5 >> 0x28);
              local_200 = (local_280->fastDelta).m_backend.exp;
              local_1fc = (local_280->fastDelta).m_backend.neg;
              local_1f8._0_4_ = (local_280->fastDelta).m_backend.fpclass;
              local_1f8._4_4_ = (local_280->fastDelta).m_backend.prec_elem;
              if ((fpclass_type)local_1f8 != cpp_dec_float_finite || local_228.info != 0) {
                local_1fc = (bool)(local_1fc ^ 1);
              }
            }
LAB_002db478:
            pcVar24 = (cpp_dec_float<50U,_int,_void> *)&local_228;
          }
          local_28c = false;
          local_290 = 0;
          uStack_293 = 0;
          _local_298 = 0;
          uStack_29b = 0;
          _uStack_2a0 = 0;
          local_2b8 = ZEXT816(0);
          local_288._0_4_ = cpp_dec_float_finite;
          local_288._4_4_ = 10;
          local_2a8.info = 0;
          local_2a8.idx = 0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_2b8,pcVar24,&local_278);
          local_278.data._M_elems[8] = (uint)_local_298;
          local_278.data._M_elems[9] = (uint)(CONCAT35(uStack_293,_local_298) >> 0x20);
          local_278.data._M_elems[4] = local_2a8.info;
          local_278.data._M_elems[5] = local_2a8.idx;
          local_278.data._M_elems[6] = (uint)_uStack_2a0;
          local_278.data._M_elems[7] = (uint)(CONCAT35(uStack_29b,_uStack_2a0) >> 0x20);
          local_278.data._M_elems[0] = local_2b8._0_4_;
          local_278.data._M_elems[1] = local_2b8._4_4_;
          local_278.data._M_elems[2] = local_2b8._8_4_;
          local_278.data._M_elems[3] = local_2b8._12_4_;
          local_278.exp = local_290;
          local_278.neg = local_28c;
          local_278.fpclass = (fpclass_type)local_288;
          local_278.prec_elem = local_288._4_4_;
          pSVar26 = local_280;
          piVar30 = local_230;
          if ((((fpclass_type)local_288 != cpp_dec_float_NaN) &&
              (local_168.fpclass != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_278,&local_168), pSVar26 = local_280, piVar30 = local_230,
             0 < iVar15)) {
            local_168.data._M_elems[9] = local_278.data._M_elems[9];
            local_168.data._M_elems[8] = local_278.data._M_elems[8];
            local_168.data._M_elems[1] = local_278.data._M_elems[1];
            local_168.data._M_elems[0] = local_278.data._M_elems[0];
            local_168.data._M_elems[3] = local_278.data._M_elems[3];
            local_168.data._M_elems[2] = local_278.data._M_elems[2];
            local_168.data._M_elems[5] = local_278.data._M_elems[5];
            local_168.data._M_elems[4] = local_278.data._M_elems[4];
            local_168.data._M_elems[7] = local_278.data._M_elems[7];
            local_168.data._M_elems[6] = local_278.data._M_elems[6];
            local_168.exp = local_278.exp;
            local_168.neg = local_278.neg;
            local_168.fpclass = local_278.fpclass;
            local_168.prec_elem = local_278.prec_elem;
            local_234 = (int)lVar27;
          }
        }
        else {
          local_288._0_4_ = cpp_dec_float_finite;
          local_288._4_4_ = 10;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8.info = 0;
          local_2a8.idx = 0;
          _uStack_2a0 = 0;
          uStack_29b = 0;
          _local_298 = 0;
          uStack_293 = 0;
          local_290 = 0;
          local_28c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_2b8,0.0);
          pDVar22 = local_128;
          iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_278,(cpp_dec_float<50U,_int,_void> *)local_2b8);
          pSVar26 = local_280;
          if (iVar15 != 0) goto LAB_002da98d;
        }
LAB_002db581:
        lVar27 = lVar27 + 1;
        lVar29 = lVar29 + 8;
        pnVar18 = (pointer)((long)&pnVar6[1].m_backend.data + lVar17);
        lVar17 = lVar17 + 0x38;
      } while (pnVar18 < local_70);
      piVar28 = (local_58->thedelta).super_IdxSet.idx;
    }
    (local_58->thedelta).super_IdxSet.num = (int)((ulong)((long)piVar30 - (long)piVar28) >> 2);
    (local_58->thedelta).setupStatus = true;
  }
  *(undefined8 *)((local_40->m_backend).data._M_elems + 8) = local_168.data._M_elems._32_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 4) = local_168.data._M_elems._16_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 6) = local_168.data._M_elems._24_8_;
  *(undefined8 *)(local_40->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
  *(undefined8 *)((local_40->m_backend).data._M_elems + 2) = local_168.data._M_elems._8_8_;
  (local_40->m_backend).exp = local_168.exp;
  (local_40->m_backend).neg = local_168.neg;
  (local_40->m_backend).fpclass = local_168.fpclass;
  (local_40->m_backend).prec_elem = local_168.prec_elem;
  *(ulong *)((local_38->m_backend).data._M_elems + 8) =
       CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]);
  *(ulong *)((local_38->m_backend).data._M_elems + 4) =
       CONCAT44(local_1a8.data._M_elems[5],local_1a8.data._M_elems[4]);
  *(ulong *)((local_38->m_backend).data._M_elems + 6) =
       CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]);
  *(ulong *)(local_38->m_backend).data._M_elems =
       CONCAT44(local_1a8.data._M_elems[1],local_1a8.data._M_elems[0]);
  *(ulong *)((local_38->m_backend).data._M_elems + 2) =
       CONCAT44(local_1a8.data._M_elems[3],local_1a8.data._M_elems[2]);
  (local_38->m_backend).exp = local_1a8.exp;
  (local_38->m_backend).neg = local_1a8.neg;
  (local_38->m_backend).fpclass = local_1a8.fpclass;
  (local_38->m_backend).prec_elem = local_1a8.prec_elem;
  return local_234;
}

Assistant:

int SPxFastRT<R>::minDelta(
   R& val,
   R& maxabs,
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = (this->m_type == SPxSolverBase<R>::LEAVE);
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;
         x = upd[i];

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x > max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse VectorBase<R> update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;


            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x > max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;

   return sel;
}